

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

bool FIX::double_conversion::ConsumeSubString<unsigned_short_const*>
               (unsigned_short **current,unsigned_short *end,char *substring)

{
  char cVar1;
  char cVar2;
  ushort *puVar3;
  char *pcVar4;
  
  if ((uint)**current != (int)*substring) {
    __assert_fail("**current == *substring",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x1a9,
                  "bool FIX::double_conversion::ConsumeSubString(Iterator *, Iterator, const char *) [Iterator = const unsigned short *]"
                 );
  }
  puVar3 = *current;
  pcVar4 = substring + 1;
  do {
    puVar3 = puVar3 + 1;
    cVar1 = *pcVar4;
    *current = puVar3;
    if ((cVar1 == '\0') || (puVar3 == end)) break;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while ((uint)*puVar3 == (int)cVar2);
  return cVar1 == '\0';
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}